

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_zip_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  sbyte sVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t *m;
  uint32_t *n;
  ARMPredicateReg tmp_m;
  ARMPredicateReg tmp_n;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  uVar4 = pred_desc & 0x1f;
  uVar1 = uVar4 + 2;
  uVar5 = (ulong)uVar1;
  uVar8 = pred_desc >> 10 & 3;
  uVar12 = pred_desc >> 0xc & 1;
  sVar6 = (sbyte)uVar8;
  if (uVar4 < 7) {
    bVar7 = (char)uVar12 * (char)uVar1 * '\x04';
    uVar10 = 0xffffffffffffffff >> ((char)uVar1 * -4 & 0x3fU);
    uVar9 = *vn >> (bVar7 & 0x3f) & uVar10;
    uVar5 = 4;
    do {
      uVar9 = (uVar9 | uVar9 << ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f)) &
              even_bit_esz_masks[uVar5];
      bVar3 = uVar8 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    uVar10 = (ulong)((uint)uVar10 & (uint)(*vm >> (bVar7 & 0x3f)));
    uVar5 = 4;
    do {
      uVar10 = (uVar10 | uVar10 << ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f)) &
               even_bit_esz_masks[uVar5];
      bVar3 = uVar8 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
    *(ulong *)vd = (uVar10 << ((byte)(1 << sVar6) & 0x3f)) + uVar9;
  }
  else {
    if ((ulong)((long)vn - (long)vd) < uVar5) {
      memcpy(local_58,vn,uVar5);
      vn = local_58;
    }
    if ((ulong)((long)vm - (long)vd) < uVar5) {
      memcpy(local_78,vm,uVar5);
      vm = local_78;
    }
    uVar5 = 0;
    if (uVar12 != 0) {
      uVar5 = (ulong)(uVar1 >> 1);
    }
    if ((uVar5 & 3) == 0) {
      uVar9 = 0;
      do {
        lVar2 = uVar9 + (uVar5 >> 2);
        uVar11 = (ulong)*(uint *)((long)vn + lVar2 * 4);
        uVar13 = (ulong)*(uint *)((long)vm + lVar2 * 4);
        uVar10 = 4;
        do {
          uVar11 = (uVar11 | uVar11 << ((byte)(1 << ((byte)uVar10 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar10];
          bVar3 = uVar8 < uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar3);
        uVar10 = 4;
        do {
          uVar13 = (uVar13 | uVar13 << ((byte)(1 << ((byte)uVar10 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar10];
          bVar3 = uVar8 < uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar3);
        *(ulong *)((long)vd + uVar9 * 8) = (uVar13 << ((byte)(1 << sVar6) & 0x3f)) + uVar11;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar4 + 9 >> 3);
    }
    else {
      uVar9 = 0;
      do {
        uVar11 = (ulong)*(byte *)((long)vn + uVar9 + uVar5);
        uVar13 = (ulong)*(byte *)((long)vm + uVar9 + uVar5);
        uVar10 = 4;
        do {
          uVar11 = (uVar11 | uVar11 << ((byte)(1 << ((byte)uVar10 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar10];
          bVar3 = uVar8 < uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar3);
        uVar10 = 4;
        do {
          uVar13 = (uVar13 | uVar13 << ((byte)(1 << ((byte)uVar10 & 0x1f)) & 0x3f)) &
                   even_bit_esz_masks[uVar10];
          bVar3 = uVar8 < uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar3);
        *(short *)((long)vd + uVar9 * 2) =
             (short)((int)uVar13 << ((byte)(1 << sVar6) & 0x1f)) + (short)uVar11;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1 >> 1);
    }
  }
  return;
}

Assistant:

void HELPER(sve_zip_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    int esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    intptr_t high = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd;
    intptr_t i;

    if (oprsz <= 8) {
        uint64_t nn = *(uint64_t *)vn;
        uint64_t mm = *(uint64_t *)vm;
        int half = 4 * oprsz;

        nn = extract64(nn, high * half, half);
        mm = extract64(mm, high * half, half);
        nn = expand_bits(nn, esz);
        mm = expand_bits(mm, esz);
        d[0] = nn + (mm << (1 << esz));
    } else {
        ARMPredicateReg tmp_n, tmp_m;

        /* We produce output faster than we consume input.
           Therefore we must be mindful of possible overlap.  */
        if (((char *)vn - (char *)vd) < (uintptr_t)oprsz) {
            vn = memcpy(&tmp_n, vn, oprsz);
        }
        if (((char *)vm - (char *)vd) < (uintptr_t)oprsz) {
            vm = memcpy(&tmp_m, vm, oprsz);
        }
        if (high) {
            high = oprsz >> 1;
        }

        if ((high & 3) == 0) {
            uint32_t *n = vn, *m = vm;
            high >>= 2;

            for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
                uint64_t nn = n[H4(high + i)];
                uint64_t mm = m[H4(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d[i] = nn + (mm << (1 << esz));
            }
        } else {
            uint8_t *n = vn, *m = vm;
            uint16_t *d16 = vd;

            for (i = 0; i < oprsz / 2; i++) {
                uint16_t nn = n[H1(high + i)];
                uint16_t mm = m[H1(high + i)];

                nn = expand_bits(nn, esz);
                mm = expand_bits(mm, esz);
                d16[H2(i)] = nn + (mm << (1 << esz));
            }
        }
    }
}